

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

int lua_getuservalue(lua_State *L,int idx)

{
  ushort uVar1;
  int iVar2;
  lua_CFunction p_Var3;
  StkId pTVar4;
  GCObject *pGVar5;
  StkId pTVar6;
  int *piVar7;
  TValue *pTVar8;
  char *__assertion;
  
  iVar2 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar2 + 1;
  if (iVar2 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x3bd,"int lua_getuservalue(lua_State *, int)");
  }
  pTVar8 = index2addr(L,idx);
  if (pTVar8->tt_ != 0x8007) {
    __assert_fail("(((((o))->tt_) == (((7) | (1 << 15))))) && \"full userdata expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x3bf,"int lua_getuservalue(lua_State *, int)");
  }
  p_Var3 = (pTVar8->value_).f;
  if (p_Var3[8] == (_func_int_lua_State_ptr)0x7) {
    pTVar4 = L->top;
    pGVar5 = *(GCObject **)(p_Var3 + 0x20);
    (pTVar4->value_).gc = pGVar5;
    uVar1 = *(ushort *)(p_Var3 + 10);
    pTVar4->tt_ = uVar1;
    if ((-1 < (short)uVar1) ||
       (((uVar1 & 0x7f) == (ushort)pGVar5->tt &&
        ((pGVar5->marked & (L->l_G->currentwhite ^ 0x18)) == 0)))) {
      pTVar6 = L->top;
      pTVar4 = pTVar6 + 1;
      L->top = pTVar4;
      if (L->ci->top < pTVar4) {
        __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x3c1,"int lua_getuservalue(lua_State *, int)");
      }
      piVar7 = *(int **)&L[-1].hookmask;
      *piVar7 = *piVar7 + -1;
      if (*piVar7 == 0) {
        return pTVar6->tt_ & 0xf;
      }
      __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x3c2,"int lua_getuservalue(lua_State *, int)");
    }
    __assertion = "0";
  }
  else {
    __assertion = "(((o)->value_).gc)->tt == 7";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x3c0,"int lua_getuservalue(lua_State *, int)");
}

Assistant:

LUA_API int lua_getuservalue (lua_State *L, int idx) {
  StkId o;
  lua_lock(L);
  o = index2addr(L, idx);
  api_check(L, ttisfulluserdata(o), "full userdata expected");
  getuservalue(L, uvalue(o), L->top);
  api_incr_top(L);
  lua_unlock(L);
  return ttnov(L->top - 1);
}